

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

int read_delta_lflevel(AV1_COMMON *cm,aom_reader *r,aom_cdf_prob *cdf,MB_MODE_INFO *mbmi,int mi_col,
                      int mi_row)

{
  od_ec_dec *dec;
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int literal;
  uint uVar10;
  bool bVar11;
  
  if (((mbmi->bsize != cm->seq_params->sb_size) || (iVar5 = 0, mbmi->skip_txfm == '\0')) &&
     (iVar5 = 0, ((mi_col | mi_row) & cm->seq_params->mib_size - 1U) == 0)) {
    dec = &r->ec;
    iVar4 = od_ec_decode_cdf_q15(dec,cdf,4);
    if (r->allow_update_cdf != '\0') {
      uVar1 = cdf[4];
      bVar6 = (char)(uVar1 >> 4) + 5;
      lVar8 = 0;
      do {
        uVar2 = cdf[lVar8];
        if (lVar8 < (char)iVar4) {
          sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar6 & 0x1f));
        }
        else {
          sVar3 = -(uVar2 >> (bVar6 & 0x1f));
        }
        cdf[lVar8] = sVar3 + uVar2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      cdf[4] = cdf[4] + (ushort)(uVar1 < 0x20);
    }
    if (2 < iVar4) {
      uVar10 = 0;
      uVar9 = 4;
      do {
        iVar5 = od_ec_decode_bool_q15(dec,0x4000);
        uVar10 = uVar10 | iVar5 << ((char)uVar9 - 2U & 0x1f);
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
      uVar7 = 0;
      uVar9 = uVar10;
      if (-1 < (int)uVar10) {
        do {
          iVar5 = od_ec_decode_bool_q15(dec,0x4000);
          uVar7 = uVar7 | iVar5 << ((byte)uVar9 & 0x1f);
          iVar5 = uVar9 + 1;
          uVar9 = uVar9 - 1;
        } while (1 < iVar5);
      }
      iVar4 = (1 << ((char)uVar10 + 1U & 0x1f)) + 1 + uVar7;
    }
    if (iVar4 == 0) {
      bVar11 = false;
    }
    else {
      iVar5 = od_ec_decode_bool_q15(dec,0x4000);
      bVar11 = iVar5 == 0;
    }
    iVar5 = -iVar4;
    if (bVar11) {
      iVar5 = iVar4;
    }
  }
  return iVar5;
}

Assistant:

static int read_delta_lflevel(const AV1_COMMON *const cm, aom_reader *r,
                              aom_cdf_prob *const cdf,
                              const MB_MODE_INFO *const mbmi, int mi_col,
                              int mi_row) {
  int reduced_delta_lflevel = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int b_col = mi_col & (cm->seq_params->mib_size - 1);
  const int b_row = mi_row & (cm->seq_params->mib_size - 1);
  const int read_delta_lf_flag = (b_col == 0 && b_row == 0);

  if ((bsize != cm->seq_params->sb_size || mbmi->skip_txfm == 0) &&
      read_delta_lf_flag) {
    int abs = aom_read_symbol(r, cdf, DELTA_LF_PROBS + 1, ACCT_STR);
    const int smallval = (abs < DELTA_LF_SMALL);
    if (!smallval) {
      const int rem_bits = aom_read_literal(r, 3, ACCT_STR) + 1;
      const int thr = (1 << rem_bits) + 1;
      abs = aom_read_literal(r, rem_bits, ACCT_STR) + thr;
    }
    const int sign = abs ? aom_read_bit(r, ACCT_STR) : 1;
    reduced_delta_lflevel = sign ? -abs : abs;
  }
  return reduced_delta_lflevel;
}